

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O3

CURLcode tftp_multi_statemach(Curl_easy *data,_Bool *done)

{
  ulong uVar1;
  tftp_state_data *state_00;
  tftp_state_data *state_01;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  int iVar4;
  tftp_event_t tVar5;
  timediff_t tVar6;
  time_t tVar7;
  int *piVar8;
  char *pcVar9;
  ssize_t sVar10;
  void *pvVar11;
  size_t sVar12;
  undefined8 uVar13;
  ulong uVar14;
  size_t sVar15;
  char *fmt;
  Curl_easy *data_00;
  ushort *__s;
  ushort *puVar16;
  tftp_state_data *state;
  ulong __n;
  bool bVar17;
  curl_off_t blksize;
  char buffer [256];
  char *local_168;
  Curl_easy *local_160;
  ushort *local_158;
  _Bool *local_150;
  Curl_easy *local_148;
  socklen_t local_13c;
  char *local_138 [33];
  
  state_00 = (data->conn->proto).tftpc;
  tVar6 = Curl_timeleft(state_00->data,(curltime *)0x0,state_00->state == TFTP_STATE_START);
  if (tVar6 < 0) {
    state_00->error = TFTP_ERR_TIMEOUT;
    state_00->state = TFTP_STATE_FIN;
  }
  else {
    tVar7 = time((time_t *)0x0);
    if ((long)state_00->retry_time + state_00->rx_time < tVar7) {
      tVar7 = time((time_t *)0x0);
      state_00->rx_time = tVar7;
      *done = false;
      CVar3 = tftp_state_machine(state_00,TFTP_EVENT_TIMEOUT);
      goto joined_r0x0015c471;
    }
  }
  *done = false;
  iVar4 = Curl_socket_check(state_00->sockfd,-1,-1,0);
  if (iVar4 == 0) {
    return CURLE_OK;
  }
  if (iVar4 == -1) {
    piVar8 = __errno_location();
    pcVar9 = Curl_strerror(*piVar8,(char *)local_138,0x100);
    Curl_failf(data,"%s",pcVar9);
    state_00->event = TFTP_EVENT_ERROR;
    return CURLE_OK;
  }
  state_01 = (data->conn->proto).tftpc;
  local_13c = 0x80;
  sVar10 = recvfrom(state_01->sockfd,(state_01->rpacket).data,(ulong)state_01->blksize + 4,0,
                    (sockaddr *)&state_01->remote_addr,&local_13c);
  iVar4 = (int)sVar10;
  state_01->rbytes = iVar4;
  state_01->remote_addrlen = local_13c;
  if (iVar4 < 4) {
    Curl_failf(data,"Received too short packet");
    state_01->event = TFTP_EVENT_TIMEOUT;
  }
  else {
    puVar16 = (ushort *)(state_01->rpacket).data;
    tVar5 = (tftp_event_t)(ushort)(*puVar16 << 8 | *puVar16 >> 8);
    state_01->event = tVar5;
    switch(tVar5) {
    case TFTP_EVENT_DATA:
      if (((iVar4 != 4) &&
          ((ushort)((short)*(undefined4 *)&state_01->block + 1U) ==
           (ushort)(puVar16[1] << 8 | puVar16[1] >> 8))) &&
         (CVar3 = Curl_client_write(data,1,(char *)(puVar16 + 2),(ulong)(iVar4 - 4)),
         CVar3 != CURLE_OK)) {
        tftp_state_machine(state_01,TFTP_EVENT_ERROR);
        return CVar3;
      }
      break;
    case TFTP_EVENT_ACK:
      break;
    case TFTP_EVENT_ERROR:
      __s = puVar16 + 2;
      state_01->error = (uint)(ushort)(puVar16[1] << 8 | puVar16[1] >> 8);
      pvVar11 = memchr(__s,0,(ulong)(iVar4 - 4));
      if (((pvVar11 != (void *)0x0) && ((ulong)((long)pvVar11 - (long)__s) < (ulong)(iVar4 - 4))) &&
         ((((data->set).field_0x897 & 0x40) != 0 &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ))) {
        Curl_infof(data,"TFTP error: %s",__s);
      }
      break;
    case TFTP_EVENT_OACK:
      local_160 = state_01->data;
      state_01->blksize = 0x200;
      local_158 = (ushort *)((long)puVar16 + (ulong)(iVar4 - 2) + 2);
      puVar16 = puVar16 + 1;
      local_150 = done;
      local_148 = data;
      do {
        __n = (long)local_158 - (long)puVar16;
        pvVar11 = memchr(puVar16,0,__n);
        uVar14 = (long)pvVar11 - (long)puVar16;
        if (pvVar11 == (void *)0x0) {
          uVar14 = __n;
        }
        uVar1 = uVar14 + 1;
        sVar15 = __n - uVar1;
        if (__n < uVar1 || sVar15 == 0) {
LAB_0015c4a3:
          pcVar9 = "Malformed ACK packet, rejecting";
          data_00 = local_160;
LAB_0015c4d3:
          Curl_failf(data_00,pcVar9);
          return CURLE_TFTP_ILLEGAL;
        }
        pvVar11 = memchr((void *)(uVar1 + (long)puVar16),0,sVar15);
        sVar12 = (long)pvVar11 - (long)(uVar1 + (long)puVar16);
        if (pvVar11 == (void *)0x0) {
          sVar12 = sVar15;
        }
        uVar14 = uVar14 + sVar12 + 2;
        if (__n < uVar14) goto LAB_0015c4a3;
        sVar15 = strlen((char *)puVar16);
        data_00 = local_160;
        local_138[0] = (char *)((long)puVar16 + sVar15 + 1);
        if (((local_160 != (Curl_easy *)0x0) && (((local_160->set).field_0x897 & 0x40) != 0)) &&
           ((pcVar2 = (local_160->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
            (0 < pcVar2->log_level)))) {
          Curl_infof(local_160,"got option=(%s) value=(%s)",puVar16);
        }
        iVar4 = curl_strnequal((char *)puVar16,"blksize",7);
        data = local_148;
        done = local_150;
        if (iVar4 == 0) {
          iVar4 = curl_strnequal((char *)puVar16,"tsize",5);
          if (((iVar4 != 0) && (local_168 = (char *)0x0, ((data_00->state).field_0x7c0 & 8) == 0))
             && (iVar4 = Curl_str_number(local_138,(curl_off_t *)&local_168,0x7fffffffffffffff),
                iVar4 == 0)) {
            if (local_168 == (char *)0x0) {
              fmt = "invalid tsize -:%s:- value in OACK packet";
              pcVar9 = local_138[0];
LAB_0015c502:
              Curl_failf(data_00,fmt,pcVar9);
              return CURLE_TFTP_ILLEGAL;
            }
            if ((((data_00->set).field_0x897 & 0x40) != 0) &&
               ((pcVar2 = (data_00->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                (0 < pcVar2->log_level)))) {
              Curl_infof(data_00,"tsize parsed from OACK (%ld)");
            }
            Curl_pgrsSetDownloadSize(data_00,(curl_off_t)local_168);
          }
        }
        else {
          iVar4 = Curl_str_number(local_138,(curl_off_t *)&local_168,0xffb8);
          if (iVar4 != 0) {
            pcVar9 = "blksize is larger than max supported";
            uVar13 = 0xffb8;
LAB_0015c4f2:
            Curl_failf(data_00,"%s (%d)",pcVar9,uVar13);
            return CURLE_TFTP_ILLEGAL;
          }
          if (local_168 == (char *)0x0) {
            pcVar9 = "invalid blocksize value in OACK packet";
            goto LAB_0015c4d3;
          }
          if ((long)local_168 < 8) {
            pcVar9 = "blksize is smaller than min supported";
            uVar13 = 8;
            goto LAB_0015c4f2;
          }
          if ((char *)(ulong)state_01->requested_blksize < local_168) {
            fmt = "server requested blksize larger than allocated (%ld)";
            pcVar9 = local_168;
            goto LAB_0015c502;
          }
          state_01->blksize = (uint)local_168;
          if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x897 & 0x40) != 0)) &&
             ((pcVar2 = (data_00->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
              (0 < pcVar2->log_level)))) {
            Curl_infof(data_00,"blksize parsed from OACK (%d) requested (%d)");
          }
        }
        puVar16 = (ushort *)((long)puVar16 + uVar14);
      } while (puVar16 < local_158);
      break;
    default:
      Curl_failf(data,"%s","Internal error: Unexpected packet");
    }
    iVar4 = Curl_pgrsUpdate(data);
    if (iVar4 != 0) {
      tftp_state_machine(state_01,TFTP_EVENT_ERROR);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  CVar3 = tftp_state_machine(state_00,state_00->event);
joined_r0x0015c471:
  if (CVar3 == CURLE_OK) {
    CVar3 = CURLE_OK;
    bVar17 = state_00->state == TFTP_STATE_FIN;
    *done = bVar17;
    if (bVar17) {
      Curl_xfer_setup_nop(data);
    }
  }
  return CVar3;
}

Assistant:

static CURLcode tftp_multi_statemach(struct Curl_easy *data, bool *done)
{
  tftp_event_t event;
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct tftp_state_data *state = conn->proto.tftpc;
  timediff_t timeout_ms = tftp_state_timeout(data, &event);

  *done = FALSE;

  if(timeout_ms < 0) {
    failf(data, "TFTP response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  if(event != TFTP_EVENT_NONE) {
    result = tftp_state_machine(state, event);
    if(result)
      return result;
    *done = (state->state == TFTP_STATE_FIN);
    if(*done)
      /* Tell curl we are done */
      Curl_xfer_setup_nop(data);
  }
  else {
    /* no timeouts to handle, check our socket */
    int rc = SOCKET_READABLE(state->sockfd, 0);

    if(rc == -1) {
      /* bail out */
      int error = SOCKERRNO;
      char buffer[STRERROR_LEN];
      failf(data, "%s", Curl_strerror(error, buffer, sizeof(buffer)));
      state->event = TFTP_EVENT_ERROR;
    }
    else if(rc) {
      result = tftp_receive_packet(data);
      if(result)
        return result;
      result = tftp_state_machine(state, state->event);
      if(result)
        return result;
      *done = (state->state == TFTP_STATE_FIN);
      if(*done)
        /* Tell curl we are done */
        Curl_xfer_setup_nop(data);
    }
    /* if rc == 0, then select() timed out */
  }

  return result;
}